

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsimplex_p.cpp
# Opt level: O1

void __thiscall QSimplexConstraint::invert(QSimplexConstraint *this)

{
  Span *pSVar1;
  ulong uVar2;
  Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *pDVar3;
  Data *pDVar4;
  ulong uVar5;
  
  this->constant = -this->constant;
  this->ratio = MoreOrEqual - this->ratio;
  pDVar3 = (this->variables).d;
  if (pDVar3 == (Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *)0x0) {
    pDVar4 = (Data *)0x0;
  }
  else {
    if (1 < (uint)(pDVar3->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      pDVar3 = QHashPrivate::Data<QHashPrivate::Node<QSimplexVariable_*,_double>_>::detached(pDVar3)
      ;
      (this->variables).d = pDVar3;
    }
    pDVar4 = (this->variables).d;
    if (pDVar4->spans->offsets[0] == 0xff) {
      uVar2 = 1;
      do {
        uVar5 = uVar2;
        if (pDVar4->numBuckets == uVar5) {
          pDVar4 = (Data *)0x0;
          uVar5 = 0;
          break;
        }
        uVar2 = uVar5 + 1;
      } while (pDVar4->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f] == 0xff);
      goto LAB_0065287f;
    }
  }
  uVar5 = 0;
LAB_0065287f:
  if (uVar5 != 0 || pDVar4 != (Data *)0x0) {
    do {
      pSVar1 = pDVar4->spans;
      *(ulong *)(pSVar1[uVar5 >> 7].entries[pSVar1[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f]].storage.
                 data + 8) =
           *(ulong *)(pSVar1[uVar5 >> 7].entries[pSVar1[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f]].
                      storage.data + 8) ^ 0x8000000000000000;
      do {
        if (pDVar4->numBuckets - 1 == uVar5) {
          uVar5 = 0;
          pDVar4 = (Data *)0x0;
          break;
        }
        uVar5 = uVar5 + 1;
      } while (pSVar1[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f] == 0xff);
    } while (uVar5 != 0 || pDVar4 != (Data *)0x0);
  }
  return;
}

Assistant:

void QSimplexConstraint::invert()
{
    constant = -constant;
    ratio = Ratio(2 - ratio);

    for (auto iter = variables.begin(); iter != variables.end(); ++iter)
        iter.value() = -iter.value();
}